

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_ShmtBase.cpp
# Opt level: O3

bool __thiscall axl::io::ShmtBase::ensureMappingSize(ShmtBase *this,size_t size)

{
  File *this_00;
  int32_t *piVar1;
  int iVar2;
  uint64_t uVar3;
  ShmtFileHdr *pSVar4;
  bool bVar5;
  ulong __length;
  bool bVar6;
  undefined4 extraout_var;
  
  bVar5 = true;
  if ((this->m_mapping).m_size < size) {
    if ((g::getModule()::module == '\0') &&
       (iVar2 = __cxa_guard_acquire(&g::getModule()::module), iVar2 != 0)) {
      g::Module::Module((Module *)g::getModule()::module);
      __cxa_atexit(g::Module::~Module,g::getModule()::module,&__dso_handle);
      __cxa_guard_release(&g::getModule()::module);
    }
    __length = -g::getModule()::module._8_8_ & (size + g::getModule()::module._8_8_) - 1;
    pSVar4 = this->m_hdr;
    while( true ) {
      piVar1 = &pSVar4->m_lock;
      LOCK();
      bVar6 = *piVar1 == 0;
      if (bVar6) {
        *piVar1 = 1;
      }
      UNLOCK();
      if (bVar6) break;
      sched_yield();
    }
    this_00 = &this->m_file;
    uVar3 = psx::File::getSize(&this_00->m_file);
    if ((uVar3 < __length) &&
       (iVar2 = ftruncate64((this_00->m_file).
                            super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h,
                            __length), iVar2 == -1)) {
      err::setLastSystemError();
      bVar5 = false;
      piVar1 = &this->m_hdr->m_lock;
      LOCK();
      if (*piVar1 == 1) {
        *piVar1 = 0;
      }
      UNLOCK();
    }
    else {
      piVar1 = &this->m_hdr->m_lock;
      LOCK();
      if (*piVar1 == 1) {
        *piVar1 = 0;
      }
      UNLOCK();
      iVar2 = Mapping::open(&this->m_mapping,(char *)this_00,0,__length,0);
      pSVar4 = (ShmtFileHdr *)CONCAT44(extraout_var,iVar2);
      if (pSVar4 == (ShmtFileHdr *)0x0) {
        bVar5 = false;
      }
      else {
        this->m_hdr = pSVar4;
        this->m_data = (char *)(pSVar4 + 1);
      }
    }
  }
  return bVar5;
}

Assistant:

bool
ShmtBase::ensureMappingSize(size_t size) {
	if (size <= m_mapping.getSize())
		return true;

	const g::SystemInfo* systemInfo = g::getModule()->getSystemInfo();
	size = sl::align(size, systemInfo->m_pageSize);

#if (_AXL_OS_POSIX)
	sys::atomicLock(&m_hdr->m_lock);
	if (size <= m_file.getSize()) {
		sys::atomicUnlock(&m_hdr->m_lock);
	} else {
		bool result = m_file.setSize(size);
		sys::atomicUnlock(&m_hdr->m_lock);
		if (!result)
			return false;
	}
#endif

	void* p = m_mapping.open(&m_file, 0, size);
	if (!p)
		return false;

	m_hdr = (ShmtFileHdr*)p;
	m_data = (char*)(m_hdr + 1);
	return true;
}